

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
HdlcSimulationDataGenerator::CreateHDLCFrame
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *address,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *control,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *information)

{
  difference_type __offset;
  HdlcSimulationDataGenerator *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> allFields;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fcs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,0,
             (address->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (address->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
             local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  this_00 = (HdlcSimulationDataGenerator *)
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
             local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (information->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (information->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  GenFcs(&local_30,this_00,this->mSettings->mHdlcFcs,&local_48);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
             local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (this->mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    TransmitBitSync(this,&local_48);
  }
  else {
    TransmitByteAsync(this,&local_48);
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HdlcSimulationDataGenerator::CreateHDLCFrame( const vector<U8>& address, const vector<U8>& control, const vector<U8>& information )
{
    vector<U8> allFields;

    allFields.insert( allFields.end(), address.begin(), address.end() );
    allFields.insert( allFields.end(), control.begin(), control.end() );
    allFields.insert( allFields.end(), information.begin(), information.end() );

    // Calculate the crc of the address, control and data fields
    vector<U8> fcs = GenFcs( mSettings->mHdlcFcs, allFields );
    allFields.insert( allFields.end(), fcs.begin(), fcs.end() );

    // Transmit the frame in bit-sync or byte-async
    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        TransmitBitSync( allFields );
    }
    else
    {
        TransmitByteAsync( allFields );
    }
}